

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  SUNMatrix A_00;
  long lVar11;
  long lVar12;
  long lVar13;
  
  iVar10 = SMCompatible_Band(A,B);
  if (iVar10 == 0) {
    iVar10 = -0x2bd;
  }
  else {
    pvVar5 = B->content;
    iVar1 = *(int *)((long)pvVar5 + 0xc);
    pvVar6 = A->content;
    iVar10 = *(int *)((long)pvVar6 + 0xc);
    if ((iVar10 < iVar1) ||
       (iVar2 = *(int *)((long)pvVar5 + 0x10), *(int *)((long)pvVar6 + 0x10) < iVar2)) {
      iVar2 = *(int *)((long)pvVar6 + 4);
      iVar3 = *(int *)((long)pvVar5 + 0x10);
      if (*(int *)((long)pvVar5 + 0x10) < *(int *)((long)pvVar6 + 0x10)) {
        iVar3 = *(int *)((long)pvVar6 + 0x10);
      }
      if (iVar1 < iVar10) {
        iVar1 = iVar10;
      }
      iVar10 = iVar2 + -1;
      if (iVar3 + iVar1 < iVar2) {
        iVar10 = iVar3 + iVar1;
      }
      A_00 = SUNBandMatrixStorage(iVar2,iVar1,iVar3,iVar10,A->sunctx);
      pvVar5 = A->content;
      iVar10 = *(int *)((long)pvVar5 + 4);
      if (0 < (long)iVar10) {
        lVar7 = *(long *)((long)pvVar5 + 0x28);
        iVar1 = *(int *)((long)pvVar5 + 0x14);
        lVar8 = *(long *)((long)A_00->content + 0x28);
        iVar2 = *(int *)((long)A_00->content + 0x14);
        iVar3 = *(int *)((long)pvVar5 + 0xc);
        iVar4 = *(int *)((long)pvVar5 + 0x10);
        lVar11 = 0;
        do {
          if (SBORROW4(iVar4,-iVar3) == iVar4 + iVar3 < 0) {
            lVar9 = *(long *)(lVar8 + lVar11 * 8);
            lVar12 = *(long *)(lVar7 + lVar11 * 8);
            lVar13 = 0;
            do {
              *(double *)(lVar9 + (long)iVar2 * 8 + (long)iVar3 * -8 + lVar13 * 8) =
                   *(double *)(lVar12 + (long)iVar1 * 8 + (long)iVar3 * -8 + lVar13 * 8) * c;
              lVar13 = lVar13 + 1;
            } while (iVar4 + iVar3 + 1 != (int)lVar13);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != iVar10);
      }
      pvVar6 = B->content;
      iVar10 = *(int *)((long)pvVar6 + 4);
      if (0 < (long)iVar10) {
        lVar7 = *(long *)((long)pvVar6 + 0x28);
        iVar1 = *(int *)((long)pvVar6 + 0x14);
        lVar8 = *(long *)((long)A_00->content + 0x28);
        iVar2 = *(int *)((long)A_00->content + 0x14);
        iVar3 = *(int *)((long)pvVar6 + 0xc);
        iVar4 = *(int *)((long)pvVar6 + 0x10);
        lVar11 = 0;
        do {
          if (SBORROW4(iVar4,-iVar3) == iVar4 + iVar3 < 0) {
            lVar12 = *(long *)(lVar8 + lVar11 * 8) + (long)iVar2 * 8 + (long)iVar3 * -8;
            lVar9 = *(long *)(lVar7 + lVar11 * 8);
            lVar13 = 0;
            do {
              *(double *)(lVar12 + lVar13 * 8) =
                   *(double *)(lVar9 + (long)iVar1 * 8 + (long)iVar3 * -8 + lVar13 * 8) +
                   *(double *)(lVar12 + lVar13 * 8);
              lVar13 = lVar13 + 1;
            } while (iVar4 + iVar3 + 1 != (int)lVar13);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != iVar10);
      }
      free(*(void **)((long)pvVar5 + 0x18));
      pvVar5 = A->content;
      iVar10 = 0;
      *(undefined8 *)((long)pvVar5 + 0x18) = 0;
      free(*(void **)((long)pvVar5 + 0x28));
      pvVar5 = A->content;
      *(undefined8 *)((long)pvVar5 + 0x28) = 0;
      free(pvVar5);
      A->content = (void *)0x0;
      A->content = A_00->content;
      A_00->content = (void *)0x0;
      SUNMatDestroy_Band(A_00);
    }
    else {
      iVar10 = *(int *)((long)pvVar6 + 4);
      if (0 < (long)iVar10) {
        lVar7 = *(long *)((long)pvVar6 + 0x28);
        iVar3 = *(int *)((long)pvVar6 + 0x14);
        lVar8 = *(long *)((long)pvVar5 + 0x28);
        iVar4 = *(int *)((long)pvVar5 + 0x14);
        lVar11 = 0;
        do {
          if (SBORROW4(iVar2,-iVar1) == iVar2 + iVar1 < 0) {
            lVar12 = *(long *)(lVar7 + lVar11 * 8) + (long)iVar3 * 8 + (long)iVar1 * -8;
            lVar9 = *(long *)(lVar8 + lVar11 * 8);
            lVar13 = 0;
            do {
              *(double *)(lVar12 + lVar13 * 8) =
                   *(double *)(lVar12 + lVar13 * 8) * c +
                   *(double *)(lVar9 + (long)iVar4 * 8 + (long)iVar1 * -8 + lVar13 * 8);
              lVar13 = lVar13 + 1;
            } while (iVar1 + iVar2 + 1 != (int)lVar13);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != iVar10);
      }
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }

  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return SUNMAT_SUCCESS;
}